

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcePosition.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_sourcePosition_primitive_hash
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t sVar1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  size_t hash;
  sysbvm_sourcePosition_t *sourcePosition;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  sVar3 = *arguments;
  sVar1 = sysbvm_tuple_identityHash(*(sysbvm_tuple_t *)(sVar3 + 0x10));
  sVar2 = sysbvm_tuple_identityHash(*(sysbvm_tuple_t *)(sVar3 + 0x18));
  sVar1 = sysbvm_hashConcatenate(sVar1,sVar2);
  sVar2 = sysbvm_tuple_identityHash(*(sysbvm_tuple_t *)(sVar3 + 0x20));
  sVar1 = sysbvm_hashConcatenate(sVar1,sVar2);
  sVar3 = sysbvm_tuple_size_encode(context,sVar1);
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_sourcePosition_primitive_hash(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    (void)argumentCount;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_sourcePosition_t *sourcePosition = (sysbvm_sourcePosition_t*)arguments[0];
    size_t hash = sysbvm_hashConcatenate(
        sysbvm_hashConcatenate(sysbvm_tuple_identityHash(sourcePosition->sourceCode),
        sysbvm_tuple_identityHash(sourcePosition->startIndex)),
            sysbvm_tuple_identityHash(sourcePosition->endIndex));

    return sysbvm_tuple_size_encode(context, hash);
}